

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O2

uint __thiscall
GeneralHash<1,unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (GeneralHash<1,unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  uint uVar1;
  size_type sVar2;
  byte *pbVar3;
  uint answer;
  
  answer = 0;
  uVar1 = 0;
  while( true ) {
    sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar2 <= uVar1) break;
    GeneralHash<1,_unsigned_int,_unsigned_char>::fastleftshift
              ((GeneralHash<1,_unsigned_int,_unsigned_char> *)this,&answer,1);
    pbVar3 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (&(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Deque_impl_data._M_start,(ulong)uVar1);
    answer = answer ^ *(uint *)(this + (ulong)*pbVar3 * 4 + 0x10);
    uVar1 = uVar1 + 1;
  }
  return answer;
}

Assistant:

hashvaluetype hash(container &c) const {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift(answer, 1);
      answer ^= hasher.hashvalues[c[k]];
    }
    return answer;
  }